

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorspace.cpp
# Opt level: O3

SquareMatrix<3> *
pbrt::ConvertRGBColorSpace
          (SquareMatrix<3> *__return_storage_ptr__,RGBColorSpace *from,RGBColorSpace *to)

{
  Float *pFVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  int i;
  long lVar6;
  Float (*paFVar7) [3];
  SquareMatrix<3> *pSVar8;
  long lVar9;
  SquareMatrix<3> *pSVar10;
  int k;
  long lVar11;
  SquareMatrix<3> *pSVar12;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  
  bVar5 = RGBColorSpace::operator==(from,to);
  if (bVar5) {
    auVar13 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar14 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    lVar6 = 0;
    paFVar7 = (Float (*) [3])__return_storage_ptr__;
    do {
      auVar15 = vpbroadcastq_avx512f();
      lVar6 = lVar6 + 1;
      uVar2 = vpcmpeqq_avx512f(auVar15,auVar13);
      uVar3 = vpcmpeqq_avx512f(auVar15,auVar14);
      auVar15 = vpmovm2d_avx512dq((ulong)CONCAT11((char)uVar3,(char)uVar2));
      auVar15 = vpsrld_avx512f(auVar15,0x1f);
      auVar15 = vcvtdq2ps_avx512f(auVar15);
      auVar16._0_12_ = auVar15._0_12_;
      auVar16._12_4_ = paFVar7[1][0];
      auVar16._16_4_ = paFVar7[1][1];
      auVar16._20_4_ = paFVar7[1][2];
      auVar16._24_4_ = paFVar7[2][0];
      auVar16._28_4_ = paFVar7[2][1];
      auVar16._32_4_ = paFVar7[2][2];
      auVar16._36_4_ = ((SquareMatrix<3> *)(paFVar7 + 3))->m[0][0];
      auVar16._40_4_ = ((SquareMatrix<3> *)(paFVar7 + 3))->m[0][1];
      auVar16._44_4_ = ((SquareMatrix<3> *)(paFVar7 + 3))->m[0][2];
      auVar16._48_4_ = paFVar7[4][0];
      auVar16._52_4_ = paFVar7[4][1];
      auVar16._56_4_ = paFVar7[4][2];
      auVar16._60_4_ = paFVar7[5][0];
      *(undefined1 (*) [64])paFVar7 = auVar16;
      paFVar7 = paFVar7 + 1;
    } while (lVar6 != 3);
  }
  else {
    auVar13 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar14 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    pSVar12 = &to->RGBFromXYZ;
    lVar6 = 0;
    paFVar7 = (Float (*) [3])__return_storage_ptr__;
    do {
      auVar15 = vpbroadcastq_avx512f();
      lVar6 = lVar6 + 1;
      uVar2 = vpcmpeqq_avx512f(auVar15,auVar13);
      uVar3 = vpcmpeqq_avx512f(auVar15,auVar14);
      auVar15 = vpmovm2d_avx512dq((ulong)CONCAT11((char)uVar3,(char)uVar2));
      auVar15 = vpsrld_avx512f(auVar15,0x1f);
      auVar15 = vcvtdq2ps_avx512f(auVar15);
      auVar15._12_4_ = paFVar7[1][0];
      auVar15._16_4_ = paFVar7[1][1];
      auVar15._20_4_ = paFVar7[1][2];
      auVar15._24_4_ = paFVar7[2][0];
      auVar15._28_4_ = paFVar7[2][1];
      auVar15._32_4_ = paFVar7[2][2];
      auVar15._36_4_ = ((SquareMatrix<3> *)(paFVar7 + 3))->m[0][0];
      auVar15._40_4_ = ((SquareMatrix<3> *)(paFVar7 + 3))->m[0][1];
      auVar15._44_4_ = ((SquareMatrix<3> *)(paFVar7 + 3))->m[0][2];
      auVar15._48_4_ = paFVar7[4][0];
      auVar15._52_4_ = paFVar7[4][1];
      auVar15._56_4_ = paFVar7[4][2];
      auVar15._60_4_ = paFVar7[5][0];
      *(undefined1 (*) [64])paFVar7 = auVar15;
      paFVar7 = paFVar7 + 1;
    } while (lVar6 != 3);
    lVar6 = 0;
    do {
      lVar9 = 0;
      pSVar8 = &from->XYZFromRGB;
      do {
        auVar13 = ZEXT1664((undefined1  [16])0x0);
        lVar11 = 0;
        pSVar10 = pSVar8;
        do {
          pFVar1 = pSVar12->m[0] + lVar11;
          lVar11 = lVar11 + 1;
          auVar4 = vfmadd231ss_fma(auVar13._0_16_,ZEXT416((uint)*pFVar1),
                                   ZEXT416((uint)pSVar10->m[0][0]));
          auVar13 = ZEXT1664(auVar4);
          pSVar10 = (SquareMatrix<3> *)(pSVar10->m + 1);
        } while (lVar11 != 3);
        __return_storage_ptr__->m[lVar6][lVar9] = auVar4._0_4_;
        lVar9 = lVar9 + 1;
        pSVar8 = (SquareMatrix<3> *)(pSVar8->m[0] + 1);
      } while (lVar9 != 3);
      lVar6 = lVar6 + 1;
      pSVar12 = (SquareMatrix<3> *)(pSVar12->m + 1);
    } while (lVar6 != 3);
  }
  return __return_storage_ptr__;
}

Assistant:

SquareMatrix<3> ConvertRGBColorSpace(const RGBColorSpace &from, const RGBColorSpace &to) {
    if (from == to)
        return {};
    return to.RGBFromXYZ * from.XYZFromRGB;
}